

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex_ensure.h
# Opt level: O0

cellid_t __thiscall trimesh::mscomplex_t::vertid(mscomplex_t *this,int i)

{
  size_type sVar1;
  ostream *poVar2;
  runtime_error *this_00;
  const_reference pvVar3;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [380];
  int local_14;
  mscomplex_t *pmStack_10;
  int i_local;
  mscomplex_t *this_local;
  
  local_14 = i;
  pmStack_10 = this;
  if (-1 < i) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->m_cp_vertid);
    if (i < (int)sVar1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_cp_vertid,(long)local_14)
      ;
      return *pvVar3;
    }
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"Failed to assert condition ");
  poVar2 = std::operator<<(poVar2,"is_in_range(i,0,(int)m_cp_vertid.size())");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"at (");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex_ensure.h"
                          );
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"vertid");
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x44);
  poVar2 = std::operator<<(poVar2,") \n ");
  poVar2 = std::operator<<(poVar2,"i");
  poVar2 = std::operator<<(poVar2," = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
  std::operator<<(poVar2,"\n");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(this_00,local_1d0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline cellid_t mscomplex_t::vertid(int i) const
{
  ASSERTV(is_in_range(i,0,(int)m_cp_vertid.size()),i);

  return m_cp_vertid[i];
}